

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell::
~TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell
          (TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell *this)

{
  TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell *this_local;
  
  ~TEST_MockCallTest_expectOneCallInScopeButNotHappen_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButNotHappen)
{

    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("scope::foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock("scope").expectOneCall("foobar");
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

}